

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_ELSI.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  time_t tVar3;
  FactoredDecPOMDPDiscreteInterface *pFVar4;
  GMAA_MAA_ELSI *this;
  ostream *poVar5;
  FactoredQFunctionStateJAOHInterface *pFVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  PlanningUnitMADPDiscreteParameters local_7a9 [5];
  undefined2 local_7a4;
  undefined1 local_7a2;
  ulong local_7a0;
  long *local_798;
  shared_count local_790 [24];
  clock_t local_778;
  clock_t local_770;
  clock_t local_768;
  clock_t local_760;
  OptimalValueDatabase db;
  string filename;
  Timing Time;
  tms ts_Qcomp;
  tms ts_before;
  string timingsFilename;
  stringstream ss;
  shared_count local_618 [8];
  ostream local_610 [382];
  char s [10];
  tms ts_after;
  ofstream of;
  uint auStack_448 [120];
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  local_7a0 = (ulong)args.horizon;
  Timing::Timing(&Time);
  std::__cxx11::string::string<std::allocator<char>>((string *)&of,"Overall",(allocator<char> *)&ss)
  ;
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&of);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  pFVar4 = (FactoredDecPOMDPDiscreteInterface *)
           ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(&args);
  (**(code **)(*(long *)(pFVar4 + *(long *)(*(long *)pFVar4 + -0xf8)) + 0x210))
            (pFVar4 + *(long *)(*(long *)pFVar4 + -0xf8),args.sparse != 0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"",(allocator<char> *)&of);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timingsFilename,"",(allocator<char> *)&of);
  std::ofstream::ofstream(&of);
  uVar8 = 0;
  if (args.dryrun == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ts_before,"GMAA_ELSI",(allocator<char> *)&ts_after);
    directories::MADPGetResultsFilename
              ((string *)&db,(MultiAgentDecisionProcessInterface *)&ts_before,
               (Arguments *)(pFVar4 + *(long *)(*(long *)pFVar4 + -0x40)));
    poVar5 = std::operator<<(local_610,(string *)&db);
    poVar5 = std::operator<<(poVar5,"_");
    qheur::SoftPrint_abi_cxx11_((Qheur_t)&ts_Qcomp);
    poVar5 = std::operator<<(poVar5,(string *)&ts_Qcomp);
    poVar5 = std::operator<<(poVar5,"_h");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)local_7a0);
    poVar5 = std::operator<<(poVar5,"_restarts");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,args.nrRestarts);
    poVar5 = std::operator<<(poVar5,"_k");
    std::ostream::operator<<(poVar5,args.k);
    std::__cxx11::string::~string((string *)&ts_Qcomp);
    std::__cxx11::string::~string((string *)&db);
    std::__cxx11::string::~string((string *)&ts_before);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&filename,(string *)&db);
    std::__cxx11::string::~string((string *)&db);
    std::ofstream::open((char *)&of,(_Ios_Openmode)filename._M_dataplus._M_p);
    uVar1 = *(uint *)((long)auStack_448 + *(long *)(_of + -0x18));
    bVar9 = (uVar1 & 5) == 0;
    if (bVar9) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,
                     &filename,"Timings");
      std::__cxx11::string::operator=((string *)&timingsFilename,(string *)&db);
      std::__cxx11::string::~string((string *)&db);
      poVar5 = std::operator<<((ostream *)&std::cout,"Computing ");
      std::__cxx11::stringbuf::str();
      poVar5 = std::operator<<(poVar5,(string *)&db);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&db);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"GMAA: could not open ");
      poVar5 = std::operator<<(poVar5,(string *)&filename);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    uVar8 = (uint)!bVar9;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    bVar7 = 0;
    bVar9 = false;
    if ((uVar1 & 5) != 0) goto LAB_00104632;
  }
  local_760 = times((tms *)&ts_before);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_7a9);
  if (3 < (int)local_7a0) {
    local_7a4 = 0;
  }
  local_7a2 = args.sparse != 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"PlanningUnit",(allocator<char> *)&db);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  this = (GMAA_MAA_ELSI *)operator_new(0x448);
  GMAA_MAA_ELSI::GMAA_MAA_ELSI(this,local_7a0,pFVar4,local_7a9);
  if (args.dryrun == 0) {
    if (args.saveTimings != 0) {
      GeneralizedMAAStarPlanner::SetIntermediateTimingFilename((string *)(this + 0x340));
    }
    if (args.saveAllBGs != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &filename,"_BG");
      std::__cxx11::string::_M_assign((string *)(this + 0x3c0));
      std::__cxx11::string::~string((string *)&ss);
    }
  }
  if (args.verbose != 0) {
    GeneralizedMAAStarPlanner::SetVerbose((int)this + 0x340);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"PlanningUnit",(allocator<char> *)&db);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  poVar5 = std::operator<<((ostream *)&std::cout,"GMAA Planner initialized");
  std::endl<char,std::char_traits<char>>(poVar5);
  pFVar6 = getQheuristic((GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *)this,args.qheur);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"ComputeQ",(allocator<char> *)&db);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  (**(code **)(*(long *)(pFVar6 + *(long *)(*(long *)pFVar6 + -0x60)) + 0x10))
            (pFVar6 + *(long *)(*(long *)pFVar6 + -0x60));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"ComputeQ",(allocator<char> *)&db);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  local_768 = times((tms *)&ts_Qcomp);
  poVar5 = std::operator<<((ostream *)&std::cout,"Q heuristic computed");
  std::endl<char,std::char_traits<char>>(poVar5);
  *(FactoredQFunctionStateJAOHInterface **)(this + 0x440) = pFVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"Plan",(allocator<char> *)&db);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  (**(code **)(*(long *)this + 0x18))(this);
  dVar10 = (double)(**(code **)(*(long *)this + 0x98))(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"Plan",(allocator<char> *)&db);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  std::operator<<((ostream *)&std::cout,"\nvalue=");
  poVar5 = std::ostream::_M_insert<double>(dVar10);
  std::endl<char,std::char_traits<char>>(poVar5);
  if (-1 < args.verbose) {
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    (**(code **)(*(long *)_ss + 0x38))();
    boost::detail::shared_count::~shared_count(local_618);
  }
  times((tms *)&ts_after);
  local_770 = ts_before.tms_utime;
  local_778 = ts_Qcomp.tms_utime;
  OptimalValueDatabase::OptimalValueDatabase(&db,(PlanningUnitDecPOMDPDiscrete *)this);
  poVar5 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: entry \'");
  OptimalValueDatabase::GetEntryName_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&ss);
  poVar5 = std::operator<<(poVar5,"\'");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&ss);
  if ((args.gmaa == MAAstarClassic) || (args.gmaa == MAAstar)) {
    cVar2 = OptimalValueDatabase::IsInDatabase();
    if (cVar2 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.")
      ;
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar7 = 1;
      if (args.testMode == false) {
        OptimalValueDatabase::SetOptimalValue(dVar10);
        goto LAB_0010419c;
      }
    }
    else {
      cVar2 = OptimalValueDatabase::IsOptimal(dVar10);
      if (cVar2 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::operator<<(local_610,"OptimalValueDatabase: GMAA error, computed value ");
        poVar5 = std::ostream::_M_insert<double>(dVar10);
        poVar5 = std::operator<<(poVar5," does not match");
        std::operator<<(poVar5," previously computed optimal value ");
        dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
        std::ostream::_M_insert<double>(dVar11);
        std::__cxx11::stringbuf::str();
        poVar5 = std::operator<<((ostream *)&of,(string *)&local_798);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::stringbuf::str();
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_798);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        goto LAB_00104347;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "OptimalValueDatabase: Computed value matches with OptimalValueDatabase"
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar7 = 0;
    }
  }
  else {
    cVar2 = OptimalValueDatabase::IsInDatabase();
    if (cVar2 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Optimal value unknown.")
      ;
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar7 = args.testMode;
    }
    else {
      std::operator<<((ostream *)&std::cout,"OptimalValueDatabase: Computed value is ");
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar5 = std::ostream::_M_insert<double>(dVar10 / dVar11);
      std::operator<<(poVar5," of optimal (value ");
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
      dVar11 = (double)OptimalValueDatabase::GetOptimalValue();
      if (dVar10 <= dVar11) {
LAB_0010419c:
        bVar7 = 0;
      }
      else {
LAB_00104347:
        bVar7 = 1;
      }
    }
  }
  if (args.dryrun == 0) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&of,(int)local_7a0);
    std::operator<<(poVar5,"\t");
    sprintf(s,"%.6f",dVar10);
    poVar5 = std::operator<<((ostream *)&of,s);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<long>((long)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&of);
    std::operator<<(poVar5,"\t");
    poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&of);
    std::operator<<(poVar5,"\t");
    GeneralizedMAAStarPlanner::GetJointPolicyDiscretePure();
    (**(code **)(*local_798 + 0xa8))(&ss);
    poVar5 = std::operator<<((ostream *)&of,(string *)&ss);
    std::operator<<(poVar5,"\t");
    std::__cxx11::string::~string((string *)&ss);
    boost::detail::shared_count::~shared_count(local_790);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&of,args.k);
    std::operator<<(poVar5,"\n");
    std::ostream::flush();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Overall",(allocator<char> *)&local_798);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&ss);
  if (-1 < args.verbose) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"Timing summary");
    std::endl<char,std::char_traits<char>>(poVar5);
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  if ((args.saveTimings != 0) && (args.dryrun == 0)) {
    TimedAlgorithm::SaveTimers((string *)(this + 0x340));
  }
  OptimalValueDatabase::~OptimalValueDatabase(&db);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_7a9);
  bVar9 = true;
LAB_00104632:
  std::ofstream::~ofstream(&of);
  std::__cxx11::string::~string((string *)&timingsFilename);
  std::__cxx11::string::~string((string *)&filename);
  Timing::~Timing(&Time);
  if (bVar9) {
    uVar8 = (uint)bVar7;
  }
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return uVar8;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    bool errorOccurred=false;

    Qheur_t Qheur=args.qheur;
    int horizon=args.horizon;
    int k=args.k;
    int restarts=args.nrRestarts;
   
    try {

    Timing Time;    
    Time.Start("Overall");

    srand(time(0));

    FactoredDecPOMDPDiscreteInterface* decpomdp = 
        GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
    decpomdp->CacheFlatModels(args.sparse);
    
//    we have no sparse trans., observ. models for FactoredDecPOMDPDiscrete
//    (they are specified by a 2DNB which should be sparse enough)
//     if(args.sparse) 
//         decpomdp->SetSparse(true);

     bool optimalSolutionMethod=false;
     if(args.gmaa==MAAstar || args.gmaa==MAAstarClassic)
         optimalSolutionMethod=true;

    GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete *gmaa=0;
    FactoredQFunctionStateJAOHInterface *q;

    string filename="",timingsFilename="";
    ofstream of;
    if(!args.dryrun)
    {
        stringstream ss;
        ss << directories::MADPGetResultsFilename("GMAA_ELSI",
                *decpomdp,args)
           << "_" << SoftPrint(Qheur) << "_h" << horizon << "_restarts"
           << restarts << "_k" << k;
        filename=ss.str();
        of.open(filename.c_str());
        if(!of)
        {
            cerr << "GMAA: could not open " << filename << endl;
            return(1);
        }
        timingsFilename=filename + "Timings";

        cout << "Computing " << ss.str() << endl;
    }
    //tms timeStruct, 
    tms ts_before, ts_Qcomp, ts_after;
    clock_t ticks_before, ticks_Qcomp, ticks_after;
    
    ticks_before = times(&ts_before);

    PlanningUnitMADPDiscreteParameters params;
//    params.SetComputeAll(true);
    if(horizon >= 4)
    {
        params.SetComputeJointBeliefs(false);
        params.SetComputeJointActionObservationHistories(false);
//    params.SetComputeJointBeliefs(false);
//    params.SetUseSparseJointBeliefs(true);
    }
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    double V=-DBL_MAX;
    Time.Start("PlanningUnit");
    
    gmaa=new GMAA_MAA_ELSI(horizon, decpomdp, &params);

    if(!args.dryrun)
    {
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);

        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    if(args.verbose)
        gmaa->SetVerbose(true);

    Time.Stop("PlanningUnit");
    cout << "GMAA Planner initialized" << endl;
    
    q=getQheuristic(gmaa,Qheur);
    Time.Start("ComputeQ");
    q->Compute();
    Time.Stop("ComputeQ");
    ticks_Qcomp = times(&ts_Qcomp);
    cout << "Q heuristic computed" << endl;

    //gmaa->SetQHeuristic(q);
    gmaa->SetFactoredQHeuristic(q);
    Time.Start("Plan");
    gmaa->Plan();
    V = gmaa->GetExpectedReward();
    Time.Stop("Plan");

    cout << "\nvalue="<< V << endl;
    if(args.verbose >= 0)
        gmaa->GetJointPolicyDiscretePure()->Print();

    ticks_after = times(&ts_after);
    clock_t ticks =  ticks_after - ticks_before;
    clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;

    clock_t time_maa = ticks_after - ticks_Qcomp;
    clock_t utime_maa = ts_after.tms_utime - ts_Qcomp.tms_utime;
    clock_t time_Qcomp = ticks_Qcomp - ticks_before;
    clock_t utime_Qcomp = ts_Qcomp.tms_utime - ts_before.tms_utime;

    // check if the value corresponds to the optimal value in case
    // this is an optimal method and we already computed it before
    OptimalValueDatabase db(gmaa);
    cout<<"OptimalValueDatabase: entry '"<<db.GetEntryName()<<"'"<<endl;
    //cout<<db.SoftPrint()<<endl;
    if(optimalSolutionMethod)
    {
        if(db.IsInDatabase())
        {
            if(!db.IsOptimal(V))
            {
                stringstream ss;
                ss << "OptimalValueDatabase: GMAA error, computed value " << V 
                   << " does not match"
                   << " previously computed optimal value "
                   << db.GetOptimalValue();
                of << ss.str() << endl;
                cout << ss.str() << endl;
                errorOccurred=true;
            }
            else
                cout<<"OptimalValueDatabase: Computed value matches with OptimalValueDatabase"<<endl;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
            else // otherwise save new value
                try { db.SetOptimalValue(V);}  
                catch(E& e){ e.Print(); }
        }
    }
    else // approximate methods
    {
        if(db.IsInDatabase())
        {
            cout << "OptimalValueDatabase: Computed value is " << V / db.GetOptimalValue()
                 << " of optimal (value " << db.GetOptimalValue() << ")"
                 << endl;
            if (V>db.GetOptimalValue())
                errorOccurred=true;
        }
        else
        {
            cout << "OptimalValueDatabase: Optimal value unknown." << endl;
            if (args.testMode) // raise error when testing
                errorOccurred=true;
        }
    }

    if(!args.dryrun)
    {
        of << horizon<<"\t";
        char s[10];
        sprintf(s, "%.6f", V);
        of << s <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << time_maa <<"\t";
        of << utime_maa <<"\t";
        of << time_Qcomp <<"\t";
        of << utime_Qcomp <<"\t";
        of << gmaa->GetNrEvaluatedJPolBGs() <<"\t";
        of << gmaa->GetMaxJPolPoolSize() <<"\t";
        //of << gmaa->GetJointPolicyPureVector()->GetIndex() <<"\t";
        of << gmaa->GetJointPolicyDiscretePure()->SoftPrintBrief() <<"\t";
        of << k <<"\n";
        of.flush();
    }

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        cout << endl << "Timing summary"<<endl;
        Time.PrintSummary();
        gmaa->PrintTimersSummary();
    }
    if(args.saveTimings && !args.dryrun)
        gmaa->SaveTimers(timingsFilename);

    }
    catch(E& e){ e.Print(); }

    return errorOccurred;
}